

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

void __thiscall
anon_unknown.dwarf_bac772::TransformReplace::~TransformReplace(TransformReplace *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  
  (this->super_TransformAction)._vptr_TransformAction =
       (_func_int **)&PTR__TransformReplace_00889e10;
  std::
  vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
  ::~vector(&(this->ReplaceHelper).Replacements);
  pcVar2 = (this->ReplaceHelper).ReplaceExpression._M_dataplus._M_p;
  paVar1 = &(this->ReplaceHelper).ReplaceExpression.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->ReplaceHelper).RegularExpression.program;
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  pcVar2 = (this->ReplaceHelper).RegExString._M_dataplus._M_p;
  paVar1 = &(this->ReplaceHelper).RegExString.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->ReplaceHelper).ErrorString._M_dataplus._M_p;
  paVar1 = &(this->ReplaceHelper).ErrorString.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x160);
  return;
}

Assistant:

TransformReplace(const std::vector<std::string>& arguments,
                   cmMakefile* makefile)
    : ReplaceHelper(arguments[0], arguments[1], makefile)
  {
    makefile->ClearMatches();

    if (!this->ReplaceHelper.IsRegularExpressionValid()) {
      throw transform_error(
        cmStrCat("sub-command TRANSFORM, action REPLACE: Failed to compile "
                 "regex \"",
                 arguments[0], "\"."));
    }
    if (!this->ReplaceHelper.IsReplaceExpressionValid()) {
      throw transform_error(cmStrCat("sub-command TRANSFORM, action REPLACE: ",
                                     this->ReplaceHelper.GetError(), "."));
    }
  }